

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FIWADInfo,_FIWADInfo>::DoDelete(TArray<FIWADInfo,_FIWADInfo> *this,uint first,uint last)

{
  FIWADInfo *pFVar1;
  int iVar2;
  long lVar3;
  
  if (last != 0xffffffff) {
    if (first <= last) {
      lVar3 = (ulong)first * 0x60;
      iVar2 = (last - first) + 1;
      do {
        pFVar1 = this->Array;
        TArray<FString,_FString>::~TArray
                  ((TArray<FString,_FString> *)((long)&(pFVar1->Lumps).Array + lVar3));
        TArray<FString,_FString>::~TArray
                  ((TArray<FString,_FString> *)((long)&(pFVar1->Load).Array + lVar3));
        FString::~FString((FString *)((long)&(pFVar1->MapInfo).Chars + lVar3));
        FString::~FString((FString *)((long)&(pFVar1->Required).Chars + lVar3));
        FString::~FString((FString *)((long)&(pFVar1->Configname).Chars + lVar3));
        FString::~FString((FString *)((long)&(pFVar1->Autoname).Chars + lVar3));
        FString::~FString((FString *)((long)&(pFVar1->Name).Chars + lVar3));
        lVar3 = lVar3 + 0x60;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    return;
  }
  __assert_fail("last != ~0u",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                ,0x1ad,
                "void TArray<FIWADInfo>::DoDelete(unsigned int, unsigned int) [T = FIWADInfo, TT = FIWADInfo]"
               );
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}